

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_attach(ATTACH_HANDLE attach)

{
  AMQP_VALUE pAVar1;
  
  if (attach != (ATTACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(attach->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_attach(ATTACH_HANDLE attach)
{
    AMQP_VALUE result;

    if (attach == NULL)
    {
        result = NULL;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        result = amqpvalue_clone(attach_instance->composite_value);
    }

    return result;
}